

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O1

int CfdFinalizeMultisigSign
              (void *handle,void *multisign_handle,int net_type,char *tx_hex_string,char *txid,
              uint32_t vout,int hash_type,char *redeem_script,char **tx_string)

{
  pointer pcVar1;
  void *pvVar2;
  uint32_t vout_00;
  bool bVar3;
  AddressType AVar4;
  size_t sVar5;
  CfdException *pCVar6;
  char *__s;
  ulong uVar7;
  char *pcVar8;
  bool is_bitcoin;
  OutPoint outpoint;
  SignParameter param;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> sign_list;
  Script witness_script_obj;
  Script redeem_script_obj;
  allocator local_24a;
  bool local_249;
  undefined1 local_248 [56];
  string local_210;
  void *local_1f0;
  OutPoint local_1e8;
  void *local_1c0;
  AddressType local_1b4;
  uint32_t local_1b0;
  int local_1ac;
  undefined1 local_1a8 [32];
  pointer local_188;
  pointer local_178;
  undefined **local_160;
  _Alloc_hider local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140 [7];
  char *local_d0;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> local_c8;
  char *local_a8;
  Script local_a0;
  Script local_68;
  
  local_1f0 = multisign_handle;
  local_1c0 = handle;
  local_1ac = net_type;
  cfd::Initialize();
  pcVar1 = local_1a8 + 0x10;
  local_1a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"MultisigSign","");
  cfd::capi::CheckBuffer(local_1f0,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar1) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  bVar3 = cfd::capi::IsEmptyString(tx_hex_string);
  if (bVar3) {
    local_1a8._0_8_ = "cfdcapi_transaction.cpp";
    local_1a8._8_4_ = 0x7e8;
    local_1a8._16_8_ = "CfdFinalizeMultisigSign";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_1a8,kCfdLogLevelWarning,"tx is null or empty.");
    pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
    local_1a8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"Failed to parameter. tx is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)local_1a8);
    __cxa_throw(pCVar6,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar3 = cfd::capi::IsEmptyString(txid);
  if (bVar3) {
    local_1a8._0_8_ = "cfdcapi_transaction.cpp";
    local_1a8._8_4_ = 0x7ee;
    local_1a8._16_8_ = "CfdFinalizeMultisigSign";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_1a8,kCfdLogLevelWarning,"txid is null or empty.");
    pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
    local_1a8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"Failed to parameter. txid is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)local_1a8);
    __cxa_throw(pCVar6,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar3 = cfd::capi::IsEmptyString(redeem_script);
  if (bVar3) {
    local_1a8._0_8_ = "cfdcapi_transaction.cpp";
    local_1a8._8_4_ = 0x7f4;
    local_1a8._16_8_ = "CfdFinalizeMultisigSign";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_1a8,kCfdLogLevelWarning,"redeemScript is null or empty.");
    pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
    local_1a8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"Failed to parameter. redeemScript is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)local_1a8);
    __cxa_throw(pCVar6,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (tx_string == (char **)0x0) {
    local_1a8._0_8_ = "cfdcapi_transaction.cpp";
    local_1a8._8_4_ = 0x7fa;
    local_1a8._16_8_ = "CfdFinalizeMultisigSign";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_1a8,kCfdLogLevelWarning,"tx output is null.");
    pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
    local_1a8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"Failed to parameter. tx output is null.","");
    cfd::core::CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)local_1a8);
    __cxa_throw(pCVar6,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  AVar4 = cfd::capi::ConvertHashToAddressType(0);
  cfd::core::Script::Script(&local_a0);
  cfd::core::Script::Script(&local_68);
  if (AVar4 == kP2shAddress) {
    std::__cxx11::string::string((string *)local_248,redeem_script,(allocator *)&local_1e8);
    cfd::core::Script::Script((Script *)local_1a8,(string *)local_248);
    cfd::core::Script::operator=(&local_68,(Script *)local_1a8);
  }
  else {
    if (AVar4 != kP2wshAddress) {
      if (AVar4 != kP2shP2wshAddress) {
        local_1a8._0_8_ = "cfdcapi_transaction.cpp";
        local_1a8._8_4_ = 0x810;
        local_1a8._16_8_ = "CfdFinalizeMultisigSign";
        cfd::core::logger::log<>
                  ((CfdSourceLocation *)local_1a8,kCfdLogLevelWarning,"pkh is not target.");
        pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
        local_1a8._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a8,"Failed to parameter. hash type cannot used pkh target.","");
        cfd::core::CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)local_1a8);
        __cxa_throw(pCVar6,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException
                   );
      }
      std::__cxx11::string::string((string *)local_248,redeem_script,(allocator *)&local_1e8);
      cfd::core::Script::Script((Script *)local_1a8,(string *)local_248);
      cfd::core::Script::operator=(&local_a0,(Script *)local_1a8);
      cfd::core::Script::~Script((Script *)local_1a8);
      if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
        operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
      }
      cfd::core::ScriptUtil::CreateP2shLockingScript((Script *)local_1a8,&local_a0);
      cfd::core::Script::operator=(&local_68,(Script *)local_1a8);
      cfd::core::Script::~Script((Script *)local_1a8);
      goto LAB_004732db;
    }
    std::__cxx11::string::string((string *)local_248,redeem_script,(allocator *)&local_1e8);
    cfd::core::Script::Script((Script *)local_1a8,(string *)local_248);
    cfd::core::Script::operator=(&local_a0,(Script *)local_1a8);
  }
  cfd::core::Script::~Script((Script *)local_1a8);
  if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
    operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
  }
LAB_004732db:
  local_1b0 = vout;
  local_a8 = txid;
  if (*(uint *)((long)local_1f0 + 0x15c8) == 0) {
    local_1a8._0_8_ = "cfdcapi_transaction.cpp";
    local_1a8._8_4_ = 0x819;
    local_1a8._16_8_ = "CfdFinalizeMultisigSign";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_1a8,kCfdLogLevelWarning,"The signature has empty.");
    pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"The signature has empty.","");
    cfd::core::CfdException::CfdException(pCVar6,kCfdOutOfRangeError,(string *)local_1a8);
    __cxa_throw(pCVar6,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_1b4 = AVar4;
  local_d0 = tx_hex_string;
  if (*(uint *)((long)local_1f0 + 0x15c8) < 0x15) {
    local_c8.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_c8.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_c8.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (*(int *)((long)local_1f0 + 0x15c8) != 0) {
      pcVar8 = (char *)((long)local_1f0 + 0x10);
      __s = (char *)((long)local_1f0 + 0xb8c);
      uVar7 = 0;
      do {
        local_248._0_8_ = local_248 + 0x10;
        sVar5 = strlen(pcVar8);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_248,pcVar8,pcVar8 + sVar5);
        cfd::core::ByteData::ByteData((ByteData *)&local_1e8,(string *)local_248);
        cfd::SignParameter::SignParameter((SignParameter *)local_1a8,(ByteData *)&local_1e8);
        if (local_1e8.txid_._vptr_Txid != (_func_int **)0x0) {
          operator_delete(local_1e8.txid_._vptr_Txid,
                          (long)local_1e8.txid_.data_.data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)local_1e8.txid_._vptr_Txid);
        }
        if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
          operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
        }
        local_248._0_8_ = local_248 + 0x10;
        sVar5 = strlen(__s);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_248,__s,__s + sVar5);
        cfd::core::ByteData::ByteData((ByteData *)&local_1e8,(string *)local_248);
        bVar3 = cfd::core::Pubkey::IsValid((ByteData *)&local_1e8);
        if (local_1e8.txid_._vptr_Txid != (_func_int **)0x0) {
          operator_delete(local_1e8.txid_._vptr_Txid,
                          (long)local_1e8.txid_.data_.data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)local_1e8.txid_._vptr_Txid);
        }
        if (bVar3) {
          cfd::core::Pubkey::Pubkey((Pubkey *)&local_1e8,(string *)local_248);
          cfd::SignParameter::SetRelatedPubkey((SignParameter *)local_1a8,(Pubkey *)&local_1e8);
          if (local_1e8.txid_._vptr_Txid != (_func_int **)0x0) {
            operator_delete(local_1e8.txid_._vptr_Txid,
                            (long)local_1e8.txid_.data_.data_.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)local_1e8.txid_._vptr_Txid);
          }
        }
        std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::push_back
                  (&local_c8,(value_type *)local_1a8);
        if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
          operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
        }
        local_160 = &PTR__ScriptOperator_0087c308;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_p != local_140) {
          operator_delete(local_150._M_p,local_140[0]._M_allocated_capacity + 1);
        }
        if (local_188 != (pointer)0x0) {
          operator_delete(local_188,(long)local_178 - (long)local_188);
        }
        if ((pointer)local_1a8._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ - local_1a8._0_8_);
        }
        uVar7 = uVar7 + 1;
        pcVar8 = pcVar8 + 0x93;
        __s = __s + 0x83;
      } while (uVar7 < *(uint *)((long)local_1f0 + 0x15c8));
    }
    local_249 = false;
    cfd::capi::ConvertNetType(local_1ac,&local_249);
    std::__cxx11::string::string((string *)local_248,local_a8,(allocator *)&local_210);
    vout_00 = local_1b0;
    cfd::core::Txid::Txid((Txid *)local_1a8,(string *)local_248);
    cfd::core::OutPoint::OutPoint(&local_1e8,(Txid *)local_1a8,vout_00);
    AVar4 = local_1b4;
    local_1a8._0_8_ = &PTR__Txid_0087c9b8;
    pvVar2 = (void *)CONCAT44(local_1a8._12_4_,local_1a8._8_4_);
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2,local_1a8._24_8_ - (long)pvVar2);
    }
    if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
      operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
    }
    std::__cxx11::string::string((string *)local_1a8,redeem_script,(allocator *)&local_210);
    cfd::core::Script::Script((Script *)local_248,(string *)local_1a8);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if (local_249 == true) {
      std::__cxx11::string::string((string *)&local_210,local_d0,&local_24a);
      cfd::TransactionContext::TransactionContext((TransactionContext *)local_1a8,&local_210);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      }
      cfd::TransactionContext::AddMultisigSign
                ((TransactionContext *)local_1a8,&local_1e8,&local_c8,(Script *)local_248,AVar4);
      cfd::core::AbstractTransaction::GetHex_abi_cxx11_(&local_210,(AbstractTransaction *)local_1a8)
      ;
      pcVar8 = cfd::capi::CreateString(&local_210);
      *tx_string = pcVar8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      }
      cfd::TransactionContext::~TransactionContext((TransactionContext *)local_1a8);
    }
    else {
      std::__cxx11::string::string((string *)&local_210,local_d0,&local_24a);
      cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
                ((ConfidentialTransactionContext *)local_1a8,&local_210);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      }
      cfd::ConfidentialTransactionContext::AddMultisigSign
                ((ConfidentialTransactionContext *)local_1a8,&local_1e8,&local_c8,
                 (Script *)local_248,AVar4);
      cfd::core::AbstractTransaction::GetHex_abi_cxx11_(&local_210,(AbstractTransaction *)local_1a8)
      ;
      pcVar8 = cfd::capi::CreateString(&local_210);
      *tx_string = pcVar8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      }
      cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
                ((ConfidentialTransactionContext *)local_1a8);
    }
    cfd::core::Script::~Script((Script *)local_248);
    local_1e8.txid_._vptr_Txid = (_func_int **)&PTR__Txid_0087c9b8;
    if (local_1e8.txid_.data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1e8.txid_.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1e8.txid_.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1e8.txid_.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::~vector(&local_c8);
    cfd::core::Script::~Script(&local_68);
    cfd::core::Script::~Script(&local_a0);
    return 0;
  }
  local_1a8._0_8_ = "cfdcapi_transaction.cpp";
  local_1a8._8_4_ = 0x81f;
  local_1a8._16_8_ = "CfdFinalizeMultisigSign";
  cfd::core::logger::log<>
            ((CfdSourceLocation *)local_1a8,kCfdLogLevelWarning,
             "The number of signature has reached the upper limit.");
  pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
  local_1a8._0_8_ = local_1a8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,"The number of signature has reached the upper limit.","");
  cfd::core::CfdException::CfdException(pCVar6,kCfdOutOfRangeError,(string *)local_1a8);
  __cxa_throw(pCVar6,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdFinalizeMultisigSign(
    void* handle, void* multisign_handle, int net_type,
    const char* tx_hex_string, const char* txid, uint32_t vout, int hash_type,
    const char* redeem_script, char** tx_string) {
  try {
    cfd::Initialize();
    CheckBuffer(multisign_handle, kPrefixMultisigSignData);
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }
    if (IsEmptyString(txid)) {
      warn(CFD_LOG_SOURCE, "txid is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null or empty.");
    }
    if (IsEmptyString(redeem_script)) {
      warn(CFD_LOG_SOURCE, "redeemScript is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. redeemScript is null or empty.");
    }
    if (tx_string == nullptr) {
      warn(CFD_LOG_SOURCE, "tx output is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx output is null.");
    }

    AddressType addr_type = ConvertHashToAddressType(hash_type);
    Script witness_script_obj;
    Script redeem_script_obj;
    switch (addr_type) {
      case AddressType::kP2shAddress:
        redeem_script_obj = Script(std::string(redeem_script));
        break;
      case AddressType::kP2wshAddress:
        witness_script_obj = Script(std::string(redeem_script));
        break;
      case AddressType::kP2shP2wshAddress:
        witness_script_obj = Script(std::string(redeem_script));
        redeem_script_obj =
            ScriptUtil::CreateP2shLockingScript(witness_script_obj);
        break;
      default:
        warn(CFD_LOG_SOURCE, "pkh is not target.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. hash type cannot used pkh target.");
    }

    CfdCapiMultisigSignData* data =
        static_cast<CfdCapiMultisigSignData*>(multisign_handle);
    if (data->current_index == 0) {
      warn(CFD_LOG_SOURCE, "The signature has empty.");
      throw CfdException(
          CfdError::kCfdOutOfRangeError, "The signature has empty.");
    }
    if (data->current_index > kMultisigMaxKeyNum) {
      warn(
          CFD_LOG_SOURCE,
          "The number of signature has reached the upper limit.");
      throw CfdException(
          CfdError::kCfdOutOfRangeError,
          "The number of signature has reached the upper limit.");
    }

    std::vector<SignParameter> sign_list;
    for (uint32_t index = 0; index < data->current_index; ++index) {
      SignParameter param(ByteData(std::string(data->signatures[index])));
      std::string pubkey(data->pubkeys[index]);
      if (Pubkey::IsValid(ByteData(pubkey))) {
        param.SetRelatedPubkey(Pubkey(pubkey));
      }
      sign_list.push_back(param);
    }

    bool is_bitcoin = false;
    ConvertNetType(net_type, &is_bitcoin);
    OutPoint outpoint(Txid(txid), vout);
    Script script = Script(std::string(redeem_script));
    if (is_bitcoin) {
      TransactionContext tx(tx_hex_string);
      tx.AddMultisigSign(outpoint, sign_list, script, addr_type);
      *tx_string = CreateString(tx.GetHex());
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext tx(tx_hex_string);
      tx.AddMultisigSign(outpoint, sign_list, script, addr_type);
      *tx_string = CreateString(tx.GetHex());
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}